

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightBounds * __thiscall
pbrt::SpotLight::Bounds(LightBounds *__return_storage_ptr__,SpotLight *this)

{
  Transform *this_00;
  float fVar1;
  Float FVar2;
  float theta_e;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  Point3<float> PVar7;
  Vector3<float> VVar8;
  Tuple3<pbrt::Point3,_float> local_68;
  Tuple3<pbrt::Vector3,_float> local_58;
  Tuple3<pbrt::Vector3,_float> local_48;
  Tuple3<pbrt::Point3,_float> local_38;
  
  auVar6 = in_ZMM0._8_56_;
  this_00 = &(this->super_LightBase).renderFromLight;
  local_68.x = 0.0;
  local_68.y = 0.0;
  local_68.z = 0.0;
  PVar7 = Transform::operator()(this_00,(Point3<float> *)&local_68);
  local_38.z = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar3._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = auVar6;
  local_58.x = 0.0;
  local_58.y = 0.0;
  local_38._0_8_ = vmovlps_avx(auVar3._0_16_);
  local_58.z = 1.0;
  VVar8 = Transform::operator()(this_00,(Vector3<float> *)&local_58);
  local_48.z = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar6;
  local_48._0_8_ = vmovlps_avx(auVar4._0_16_);
  VVar8 = Normalize<float>((Vector3<float> *)&local_48);
  local_68.z = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar6;
  local_68._0_8_ = vmovlps_avx(auVar5._0_16_);
  fVar1 = this->scale;
  FVar2 = DenselySampledSpectrum::MaxValue(&this->I);
  theta_e = acosf(this->cosFalloffEnd);
  LightBounds::LightBounds
            (__return_storage_ptr__,(Point3f *)&local_38,(Vector3f *)&local_68,
             FVar2 * fVar1 * 4.0 * 3.1415927,0.0,theta_e,false);
  return __return_storage_ptr__;
}

Assistant:

LightBounds SpotLight::Bounds() const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f w = Normalize(renderFromLight(Vector3f(0, 0, 1)));
    // As in Phi()
#if 0
    Float phi = scale * I.MaxValue() * 2 * Pi * ((1 - cosFalloffStart) +
                                          (cosFalloffStart - cosFalloffEnd) / 2);
#else
    // cf. room-subsurf-from-kd.pbrt test: we sorta kinda actually want to
    // compute power as if it was an isotropic light source; the
    // LightBounds geometric terms give zero importance outside the spot
    // light's cone, so inside the cone, it doesn't matter if the overall
    // power is low; it's more accurate to effectively treat it as a point
    // light source.
    Float phi = scale * I.MaxValue() * 4 * Pi;
#endif

    return LightBounds(p, w, phi, 0.f, std::acos(cosFalloffEnd), false);
}